

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_375::NinjaMain::IsPathDead(NinjaMain *this,StringPiece s)

{
  Node *this_00;
  Edge *pEVar1;
  TimeStamp TVar2;
  undefined8 uVar3;
  string local_88;
  TimeStamp local_68;
  TimeStamp mtime;
  string err;
  Node *n;
  NinjaMain *this_local;
  StringPiece s_local;
  
  s_local.str_ = (char *)s.len_;
  err.field_2._8_8_ = s.str_;
  this_local = (NinjaMain *)err.field_2._8_8_;
  this_00 = State::LookupNode(&this->state_,s);
  if (this_00 != (Node *)0x0) {
    pEVar1 = Node::in_edge(this_00);
    if (pEVar1 != (Edge *)0x0) {
      s_local.len_._7_1_ = 0;
      goto LAB_0010b28c;
    }
  }
  std::__cxx11::string::string((string *)&mtime);
  StringPiece::AsString_abi_cxx11_(&local_88,(StringPiece *)&this_local);
  TVar2 = RealDiskInterface::Stat(&this->disk_interface_,&local_88,(string *)&mtime);
  std::__cxx11::string::~string((string *)&local_88);
  local_68 = TVar2;
  if (TVar2 == -1) {
    uVar3 = std::__cxx11::string::c_str();
    Error("%s",uVar3);
  }
  s_local.len_._7_1_ = local_68 == 0;
  std::__cxx11::string::~string((string *)&mtime);
LAB_0010b28c:
  return (bool)(s_local.len_._7_1_ & 1);
}

Assistant:

virtual bool IsPathDead(StringPiece s) const {
    Node* n = state_.LookupNode(s);
    if (n && n->in_edge())
      return false;
    // Just checking n isn't enough: If an old output is both in the build log
    // and in the deps log, it will have a Node object in state_.  (It will also
    // have an in edge if one of its inputs is another output that's in the deps
    // log, but having a deps edge product an output that's input to another deps
    // edge is rare, and the first recompaction will delete all old outputs from
    // the deps log, and then a second recompaction will clear the build log,
    // which seems good enough for this corner case.)
    // Do keep entries around for files which still exist on disk, for
    // generators that want to use this information.
    string err;
    TimeStamp mtime = disk_interface_.Stat(s.AsString(), &err);
    if (mtime == -1)
      Error("%s", err.c_str());  // Log and ignore Stat() errors.
    return mtime == 0;
  }